

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *glEffect,uint pass)

{
  MOJOSHADER_effectPass *pMVar1;
  bool bVar2;
  MOJOSHADER_effectState *pMVar3;
  MOJOSHADER_effectObject *pMStack_40;
  int has_preshader;
  MOJOSHADER_effectShader *rawFrag;
  MOJOSHADER_effectShader *rawVert;
  MOJOSHADER_effectState *state;
  MOJOSHADER_effectPass *curPass;
  uint local_18;
  int j;
  int i;
  uint pass_local;
  MOJOSHADER_glEffect *glEffect_local;
  
  rawFrag = glEffect->current_vert_raw;
  pMStack_40 = (MOJOSHADER_effectObject *)glEffect->current_frag_raw;
  bVar2 = false;
  if (ctx->bound_program != (MOJOSHADER_glProgram *)0x0) {
    glEffect->current_vert = ctx->bound_program->vertex;
    glEffect->current_frag = ctx->bound_program->fragment;
  }
  if (glEffect->effect->current_pass != -1) {
    __assert_fail("glEffect->effect->current_pass == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0xae3,"void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *, unsigned int)");
  }
  glEffect->effect->current_pass = pass;
  pMVar1 = glEffect->effect->current_technique->passes;
  local_18 = 0;
  do {
    if (pMVar1[pass].state_count <= local_18) {
      glEffect->effect->state_changes->render_state_changes = pMVar1[pass].states;
      glEffect->effect->state_changes->render_state_change_count = pMVar1[pass].state_count;
      glEffect->current_vert_raw = rawFrag;
      glEffect->current_frag_raw = (MOJOSHADER_effectShader *)pMStack_40;
      if (!bVar2) {
        MOJOSHADER_glBindShaders(glEffect->current_vert,glEffect->current_frag);
        if (glEffect->current_vert_raw != (MOJOSHADER_effectShader *)0x0) {
          glEffect->effect->state_changes->vertex_sampler_state_changes = rawFrag->samplers;
          glEffect->effect->state_changes->vertex_sampler_state_change_count =
               rawFrag->sampler_count;
        }
        if (glEffect->current_frag_raw != (MOJOSHADER_effectShader *)0x0) {
          glEffect->effect->state_changes->sampler_state_changes =
               *(MOJOSHADER_samplerStateRegister **)((long)pMStack_40 + 0x38);
          glEffect->effect->state_changes->sampler_state_change_count =
               *(uint *)((long)pMStack_40 + 0x30);
        }
      }
      MOJOSHADER_glEffectCommitChanges(glEffect);
      return;
    }
    pMVar3 = pMVar1[pass].states + (int)local_18;
    if (pMVar3->type == MOJOSHADER_RS_VERTEXSHADER) {
      curPass._4_4_ = 0;
      do {
        if (*(pMVar3->value).field_4.valuesI == glEffect->shader_indices[(int)curPass._4_4_]) {
          rawFrag = (MOJOSHADER_effectShader *)
                    (glEffect->effect->objects + *(pMVar3->value).field_4.valuesI);
          glEffect->current_vert = glEffect->shaders + (int)curPass._4_4_;
          break;
        }
        if ((glEffect->num_preshaders != 0) &&
           (*(pMVar3->value).field_4.valuesI == glEffect->preshader_indices[(int)curPass._4_4_])) {
          rawFrag = (MOJOSHADER_effectShader *)
                    (glEffect->effect->objects + *(pMVar3->value).field_4.valuesI);
          bVar2 = true;
          break;
        }
        curPass._4_4_ = curPass._4_4_ + 1;
      } while (curPass._4_4_ < glEffect->num_shaders);
    }
    else if (pMVar3->type == MOJOSHADER_RS_PIXELSHADER) {
      curPass._4_4_ = 0;
      do {
        if (*(pMVar3->value).field_4.valuesI == glEffect->shader_indices[(int)curPass._4_4_]) {
          pMStack_40 = glEffect->effect->objects + *(pMVar3->value).field_4.valuesI;
          glEffect->current_frag = glEffect->shaders + (int)curPass._4_4_;
          break;
        }
        if ((glEffect->num_preshaders != 0) &&
           (*(pMVar3->value).field_4.valuesI == glEffect->preshader_indices[(int)curPass._4_4_])) {
          pMStack_40 = glEffect->effect->objects + *(pMVar3->value).field_4.valuesI;
          bVar2 = true;
          break;
        }
        curPass._4_4_ = curPass._4_4_ + 1;
      } while (curPass._4_4_ < glEffect->num_shaders);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *glEffect,
                                  unsigned int pass)
{
    int i, j;
    MOJOSHADER_effectPass *curPass;
    MOJOSHADER_effectState *state;
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;
    int has_preshader = 0;

    if (ctx->bound_program != NULL)
    {
        glEffect->current_vert = ctx->bound_program->vertex;
        glEffect->current_frag = ctx->bound_program->fragment;
    } // if

    assert(glEffect->effect->current_pass == -1);
    glEffect->effect->current_pass = pass;
    curPass = &glEffect->effect->current_technique->passes[pass];

    // !!! FIXME: I bet this could be stored at parse/compile time. -flibit
    for (i = 0; i < curPass->state_count; i++)
    {
        state = &curPass->states[i];
        #define ASSIGN_SHADER(stype, raw, gls) \
            (state->type == stype) \
            { \
                j = 0; \
                do \
                { \
                    if (*state->value.valuesI == glEffect->shader_indices[j]) \
                    { \
                        raw = &glEffect->effect->objects[*state->value.valuesI].shader; \
                        glEffect->gls = &glEffect->shaders[j]; \
                        break; \
                    } \
                    else if (glEffect->num_preshaders > 0 \
                          && *state->value.valuesI == glEffect->preshader_indices[j]) \
                    { \
                        raw = &glEffect->effect->objects[*state->value.valuesI].shader; \
                        has_preshader = 1; \
                        break; \
                    } \
                } while (++j < glEffect->num_shaders); \
            }
        if ASSIGN_SHADER(MOJOSHADER_RS_VERTEXSHADER, rawVert, current_vert)
        else if ASSIGN_SHADER(MOJOSHADER_RS_PIXELSHADER, rawFrag, current_frag)
        #undef ASSIGN_SHADER
    } // for

    glEffect->effect->state_changes->render_state_changes = curPass->states;
    glEffect->effect->state_changes->render_state_change_count = curPass->state_count;

    glEffect->current_vert_raw = rawVert;
    glEffect->current_frag_raw = rawFrag;

    /* If this effect pass has an array of shaders, we get to wait until
     * CommitChanges to actually bind the final shaders.
     * -flibit
     */
    if (!has_preshader)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    MOJOSHADER_glEffectCommitChanges(glEffect);
}